

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::VersionString_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,int version)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  char buffer [128];
  allocator local_99;
  char local_98 [127];
  undefined1 local_19;
  
  uVar3 = (int)this >> 0x1f;
  uVar1 = (ulong)uVar3 << 0x20 | (ulong)this & 0xffffffff;
  uVar2 = (long)uVar1 / 1000;
  snprintf(local_98,0x80,"%d.%d.%d",
           (long)((ulong)uVar3 << 0x20 | (ulong)this & 0xffffffff) / 1000000 & 0xffffffff,
           (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) % 1000 &
           0xffffffff,(long)uVar1 % 1000 & 0xffffffff);
  local_19 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_98,&local_99);
  return __return_storage_ptr__;
}

Assistant:

string VersionString(int version) {
  int major = version / 1000000;
  int minor = (version / 1000) % 1000;
  int micro = version % 1000;

  // 128 bytes should always be enough, but we use snprintf() anyway to be
  // safe.
  char buffer[128];
  snprintf(buffer, sizeof(buffer), "%d.%d.%d", major, minor, micro);

  // Guard against broken MSVC snprintf().
  buffer[sizeof(buffer)-1] = '\0';

  return buffer;
}